

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printMSRMaskOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  uint uVar6;
  arm_sysreg reg;
  char *pcVar7;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar2 = MCOperand_getImm(op);
  uVar3 = MCOperand_getImm(op);
  uVar4 = ARM_getFeatureBits(MI->csh->mode);
  if (((uint)uVar4 >> 0x10 & 1) == 0) {
    uVar6 = (uint)uVar3 & 0xf;
    if ((uVar2 & 0xfffffff0) != 0) {
      SStream_concat0(O,"spsr");
      if ((uVar3 & 0xf) == 0) {
        return;
      }
      SStream_concat0(O,"_");
      reg = ARM_SYSREG_INVALID;
      if ((uVar3 & 8) != 0) {
        SStream_concat0(O,"f");
        reg = ARM_SYSREG_SPSR_F;
      }
      if ((uVar3 & 4) != 0) {
        SStream_concat0(O,"s");
        reg = reg | ARM_SYSREG_SPSR_S;
      }
      if ((uVar3 & 2) != 0) {
        SStream_concat0(O,"x");
        reg = reg + ARM_SYSREG_SPSR_X;
      }
      if ((uVar3 & 1) != 0) {
        SStream_concat0(O,"c");
        reg = reg + ARM_SYSREG_SPSR_C;
      }
      goto LAB_00160664;
    }
    if (((uint)uVar3 & 0xb) != 8 && uVar6 != 4) {
      SStream_concat0(O,"cpsr");
      if ((uVar3 & 0xf) == 0) {
        return;
      }
      SStream_concat0(O,"_");
      reg = ARM_SYSREG_INVALID;
      if ((uVar3 & 8) != 0) {
        SStream_concat0(O,"f");
        reg = ARM_SYSREG_CPSR_F;
      }
      if ((uVar3 & 4) != 0) {
        SStream_concat0(O,"s");
        reg = reg | ARM_SYSREG_CPSR_S;
      }
      if ((uVar3 & 2) != 0) {
        SStream_concat0(O,"x");
        reg = reg + ARM_SYSREG_CPSR_X;
      }
      if ((uVar3 & 1) != 0) {
        SStream_concat0(O,"c");
        reg = reg + ARM_SYSREG_CPSR_C;
      }
      goto LAB_00160664;
    }
    SStream_concat0(O,"apsr_");
    if (uVar6 == 8) {
      SStream_concat0(O,"nzcvq");
      reg = ARM_SYSREG_APSR_NZCVQ;
      goto LAB_00160664;
    }
    if (uVar6 == 0xc) {
      pcVar7 = "nzcvqg";
      goto LAB_001603a2;
    }
    pcVar7 = "g";
LAB_0016048b:
    SStream_concat0(O,pcVar7);
    reg = ARM_SYSREG_APSR_G;
    goto LAB_00160664;
  }
  iVar5 = MCOperand_getImm(op);
  uVar1 = MCInst_getOpcode(MI);
  uVar6 = (uint)iVar5 & 0xff;
  if (uVar1 != 0x999) {
    uVar6 = (uint)iVar5;
  }
  switch(uVar6) {
  case 1:
switchD_00160303_caseD_801:
    SStream_concat0(O,"iapsr");
    reg = ARM_SYSREG_IAPSR;
    break;
  case 2:
switchD_00160303_caseD_802:
    SStream_concat0(O,"eapsr");
    reg = ARM_SYSREG_EAPSR;
    break;
  case 3:
switchD_00160303_caseD_803:
    SStream_concat0(O,"xpsr");
    reg = ARM_SYSREG_XPSR;
    break;
  case 4:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00160303_caseD_804:
    SStream_concat0(O,"apsr");
    reg = ARM_SYSREG_APSR;
    break;
  case 5:
switchD_00160303_caseD_805:
    SStream_concat0(O,"ipsr");
    reg = ARM_SYSREG_IPSR;
    break;
  case 6:
switchD_00160303_caseD_806:
    SStream_concat0(O,"epsr");
    reg = ARM_SYSREG_EPSR;
    break;
  case 7:
switchD_00160303_caseD_807:
    SStream_concat0(O,"iepsr");
    reg = ARM_SYSREG_IEPSR;
    break;
  case 8:
switchD_00160303_caseD_808:
    SStream_concat0(O,"msp");
    reg = ARM_SYSREG_MSP;
    break;
  case 9:
switchD_00160303_caseD_809:
    SStream_concat0(O,"psp");
    reg = ARM_SYSREG_PSP;
    break;
  case 0x10:
switchD_00160303_caseD_810:
    SStream_concat0(O,"primask");
    reg = ARM_SYSREG_PRIMASK;
    break;
  case 0x11:
switchD_00160303_caseD_811:
    SStream_concat0(O,"basepri");
    reg = ARM_SYSREG_BASEPRI;
    break;
  case 0x12:
switchD_00160303_caseD_812:
    SStream_concat0(O,"basepri_max");
    reg = ARM_SYSREG_BASEPRI_MAX;
    break;
  case 0x13:
switchD_00160303_caseD_813:
    SStream_concat0(O,"faultmask");
    reg = ARM_SYSREG_FAULTMASK;
    break;
  case 0x14:
switchD_00160303_caseD_814:
    SStream_concat0(O,"control");
    reg = ARM_SYSREG_CONTROL;
    break;
  default:
    switch(uVar6) {
    case 0x801:
      goto switchD_00160303_caseD_801;
    case 0x802:
      goto switchD_00160303_caseD_802;
    case 0x803:
      goto switchD_00160303_caseD_803;
    case 0x804:
    case 0x80a:
    case 0x80b:
    case 0x80c:
    case 0x80d:
    case 0x80e:
    case 0x80f:
      goto switchD_00160303_caseD_804;
    case 0x805:
      goto switchD_00160303_caseD_805;
    case 0x806:
      goto switchD_00160303_caseD_806;
    case 0x807:
      goto switchD_00160303_caseD_807;
    case 0x808:
      goto switchD_00160303_caseD_808;
    case 0x809:
      goto switchD_00160303_caseD_809;
    case 0x810:
      goto switchD_00160303_caseD_810;
    case 0x811:
      goto switchD_00160303_caseD_811;
    case 0x812:
      goto switchD_00160303_caseD_812;
    case 0x813:
      goto switchD_00160303_caseD_813;
    case 0x814:
      goto switchD_00160303_caseD_814;
    default:
      switch(uVar6) {
      case 0x400:
        pcVar7 = "apsr_g";
        goto LAB_0016048b;
      case 0x401:
        SStream_concat0(O,"iapsr_g");
        reg = ARM_SYSREG_IAPSR_G;
        break;
      case 0x402:
        SStream_concat0(O,"eapsr_g");
        reg = ARM_SYSREG_EAPSR_G;
        break;
      case 0x403:
        SStream_concat0(O,"xpsr_g");
        reg = ARM_SYSREG_XPSR_G;
        break;
      default:
        switch(uVar6) {
        case 0xc00:
          pcVar7 = "apsr_nzcvqg";
LAB_001603a2:
          SStream_concat0(O,pcVar7);
          reg = ARM_SYSREG_APSR_NZCVQG;
          break;
        case 0xc01:
          SStream_concat0(O,"iapsr_nzcvqg");
          reg = ARM_SYSREG_IAPSR_NZCVQG;
          break;
        case 0xc02:
          SStream_concat0(O,"eapsr_nzcvqg");
          reg = ARM_SYSREG_EAPSR_NZCVQG;
          break;
        case 0xc03:
          SStream_concat0(O,"xpsr_nzcvqg");
          reg = ARM_SYSREG_XPSR_NZCVQG;
          break;
        default:
          goto switchD_00160303_caseD_804;
        }
      }
      break;
    }
  }
LAB_00160664:
  ARM_addSysReg(MI,reg);
  return;
}

Assistant:

static void printMSRMaskOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned SpecRegRBit = (unsigned)MCOperand_getImm(Op) >> 4;
	unsigned Mask = MCOperand_getImm(Op) & 0xf;
	unsigned reg;

	if (ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureMClass) {
		unsigned SYSm = (unsigned)MCOperand_getImm(Op);
		unsigned Opcode = MCInst_getOpcode(MI);
		// For reads of the special registers ignore the "mask encoding" bits
		// which are only for writes.
		if (Opcode == ARM_t2MRS_M)
			SYSm &= 0xff;
		switch (SYSm) {
			default: //llvm_unreachable("Unexpected mask value!");
			case     0:
			case 0x800: SStream_concat0(O, "apsr"); ARM_addSysReg(MI, ARM_SYSREG_APSR); return; // with _nzcvq bits is an alias for aspr
			case 0x400: SStream_concat0(O, "apsr_g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 0xc00: SStream_concat0(O, "apsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
			case     1:
			case 0x801: SStream_concat0(O, "iapsr"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR); return; // with _nzcvq bits is an alias for iapsr
			case 0x401: SStream_concat0(O, "iapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_G); return;
			case 0xc01: SStream_concat0(O, "iapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQG); return;
			case     2:
			case 0x802: SStream_concat0(O, "eapsr"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR); return; // with _nzcvq bits is an alias for eapsr
			case 0x402: SStream_concat0(O, "eapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_G); return;
			case 0xc02: SStream_concat0(O, "eapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQG); return;
			case     3:
			case 0x803: SStream_concat0(O, "xpsr"); ARM_addSysReg(MI, ARM_SYSREG_XPSR); return; // with _nzcvq bits is an alias for xpsr
			case 0x403: SStream_concat0(O, "xpsr_g"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_G); return;
			case 0xc03: SStream_concat0(O, "xpsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQG); return;
			case     5:
			case 0x805: SStream_concat0(O, "ipsr"); ARM_addSysReg(MI, ARM_SYSREG_IPSR); return;
			case     6:
			case 0x806: SStream_concat0(O, "epsr"); ARM_addSysReg(MI, ARM_SYSREG_EPSR); return;
			case     7:
			case 0x807: SStream_concat0(O, "iepsr"); ARM_addSysReg(MI, ARM_SYSREG_IEPSR); return;
			case     8:
			case 0x808: SStream_concat0(O, "msp"); ARM_addSysReg(MI, ARM_SYSREG_MSP); return;
			case     9:
			case 0x809: SStream_concat0(O, "psp"); ARM_addSysReg(MI, ARM_SYSREG_PSP); return;
			case  0x10:
			case 0x810: SStream_concat0(O, "primask"); ARM_addSysReg(MI, ARM_SYSREG_PRIMASK); return;
			case  0x11:
			case 0x811: SStream_concat0(O, "basepri"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI); return;
			case  0x12:
			case 0x812: SStream_concat0(O, "basepri_max"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI_MAX); return;
			case  0x13:
			case 0x813: SStream_concat0(O, "faultmask"); ARM_addSysReg(MI, ARM_SYSREG_FAULTMASK); return;
			case  0x14:
			case 0x814: SStream_concat0(O, "control"); ARM_addSysReg(MI, ARM_SYSREG_CONTROL); return;
		}
	}

	// As special cases, CPSR_f, CPSR_s and CPSR_fs prefer printing as
	// APSR_nzcvq, APSR_g and APSRnzcvqg, respectively.
	if (!SpecRegRBit && (Mask == 8 || Mask == 4 || Mask == 12)) {
		SStream_concat0(O, "apsr_");
		switch (Mask) {
			default: // llvm_unreachable("Unexpected mask value!");
			case 4:  SStream_concat0(O, "g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 8:  SStream_concat0(O, "nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
			case 12: SStream_concat0(O, "nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
		}
	}

	reg = 0;
	if (SpecRegRBit) {
		SStream_concat0(O, "spsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_SPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_SPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_SPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_SPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	} else {
		SStream_concat0(O, "cpsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_CPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_CPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_CPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_CPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	}
}